

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O1

void __thiscall
AssemblyCode::MoveRegToMemByConst::processMemoryTemps
          (MoveRegToMemByConst *this,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared,
          AssemblyCommands *newAssemblyCommands,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *spilledToOffset,CTemp *beginSP)

{
  shared_ptr<AssemblyCode::AssemblyCommand> local_18;
  
  local_18.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (thisShared->super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_18.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (thisShared->
           super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (local_18.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  onlyRightProcessMemoryTemps(newAssemblyCommands,spilledToOffset,beginSP,&local_18,&this->source);
  if (local_18.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.
               super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void AssemblyCode::MoveRegToMemByConst::processMemoryTemps( std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                                            AssemblyCommands &newAssemblyCommands,
                                                            std::map<std::string, int> &spilledToOffset,
                                                            IRT::CTemp &beginSP ) {

    onlyRightProcessMemoryTemps(newAssemblyCommands, spilledToOffset, beginSP,
                                thisShared, source);

}